

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

uint pcmpxstrx(CPUX86State *env,ZMMReg *d,ZMMReg *s,int8_t ctrl,int valids,int validd)

{
  bool bVar1;
  uint uVar2;
  sbyte sVar3;
  int iVar4;
  long lVar5;
  uint8_t *puVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  byte bVar12;
  uint uVar13;
  ulong uVar14;
  uint16_t *puVar15;
  
  iVar4 = (uint)((ctrl & 1U) == 0) * 8 + 7;
  uVar11 = valids - 1;
  uVar13 = validd - 1;
  uVar7 = (ulong)((uint)(validd <= iVar4) << 7 | (uint)(valids <= iVar4) << 6);
  env->cc_src = uVar7;
  sVar3 = (sbyte)iVar4;
  switch((byte)ctrl >> 2 & 3) {
  case 0:
    if (0 < valids) {
      uVar2 = 0;
      uVar14 = (ulong)uVar11;
      do {
        switch(ctrl & 3U) {
        case 0:
          uVar11 = (uint)s->_b_ZMMReg[uVar14];
          break;
        case 1:
          uVar11 = (uint)s->_w_ZMMReg[uVar14];
          break;
        case 2:
          uVar11 = (uint)(char)s->_b_ZMMReg[uVar14];
          break;
        case 3:
          uVar11 = (uint)(short)s->_w_ZMMReg[uVar14];
        }
        uVar2 = uVar2 * 2;
        lVar5 = (ulong)uVar13 + 1;
        if (0 < validd) {
          do {
            switch(ctrl & 3U) {
            case 0:
              uVar8 = (uint)d->_b_ZMMReg[lVar5 + -1];
              break;
            case 1:
              uVar8 = (uint)*(ushort *)((long)d + lVar5 * 2 + -2);
              break;
            case 2:
              uVar8 = (uint)(char)d->_b_ZMMReg[lVar5 + -1];
              break;
            case 3:
              uVar8 = (uint)*(short *)((long)d + lVar5 * 2 + -2);
            }
            uVar2 = uVar2 | uVar11 == uVar8;
            lVar10 = lVar5 + -1;
            bVar1 = 0 < lVar5;
            lVar5 = lVar10;
          } while (lVar10 != 0 && bVar1);
        }
        bVar1 = 0 < (long)uVar14;
        uVar14 = uVar14 - 1;
      } while (bVar1);
      goto LAB_0051202a;
    }
    break;
  case 1:
    if (0 < valids) {
      bVar12 = ctrl & 3;
      uVar14 = (ulong)uVar11;
      uVar2 = 0;
      switch(bVar12) {
      case 1:
        goto switchD_00511f68_caseD_1;
      case 2:
        goto switchD_00511f68_caseD_2;
      case 3:
        goto switchD_00511f68_caseD_3;
      }
switchD_00511f68_caseD_0:
      uVar11 = (uint)s->_b_ZMMReg[uVar14];
      do {
        lVar5 = (long)(int)(validd | 1U) + 2;
        if (1 < (int)(validd | 1U)) {
          do {
            switch(bVar12) {
            case 0:
              uVar13 = (uint)d->_b_ZMMReg[lVar5 + -4];
              break;
            case 1:
              uVar13 = (uint)*(ushort *)((long)d + lVar5 * 2 + -8);
              break;
            case 2:
              uVar13 = (uint)(char)d->_b_ZMMReg[lVar5 + -4];
              break;
            case 3:
              uVar13 = (uint)*(short *)((long)d + lVar5 * 2 + -8);
            }
            uVar8 = 0;
            if ((int)uVar11 <= (int)uVar13) {
              switch(bVar12) {
              case 0:
                uVar13 = (uint)d->_b_ZMMReg[lVar5 + -5];
                break;
              case 1:
                uVar13 = (uint)*(ushort *)((long)d + lVar5 * 2 + -10);
                break;
              case 2:
                uVar13 = (uint)(char)d->_b_ZMMReg[lVar5 + -5];
                break;
              case 3:
                uVar13 = (uint)*(short *)((long)d + lVar5 * 2 + -10);
              }
              uVar8 = (uint)((int)uVar13 <= (int)uVar11);
            }
            uVar2 = uVar2 | uVar8;
            lVar5 = lVar5 + -2;
          } while (3 < lVar5);
        }
        if ((long)uVar14 < 1) goto LAB_0051202a;
        uVar14 = uVar14 - 1;
        uVar2 = uVar2 * 2;
        switch(bVar12) {
        case 0:
          goto switchD_00511f68_caseD_0;
        case 1:
switchD_00511f68_caseD_1:
          uVar11 = (uint)s->_w_ZMMReg[uVar14];
          break;
        case 2:
switchD_00511f68_caseD_2:
          uVar11 = (uint)(char)s->_b_ZMMReg[uVar14];
          break;
        case 3:
switchD_00511f68_caseD_3:
          uVar11 = (uint)(short)s->_w_ZMMReg[uVar14];
        }
      } while( true );
    }
    break;
  case 2:
    uVar2 = uVar13;
    if ((int)uVar13 < (int)uVar11) {
      uVar2 = uVar11;
    }
    uVar8 = uVar13;
    if ((int)uVar11 < (int)uVar13) {
      uVar8 = uVar11;
    }
    lVar10 = (long)(int)uVar11 - (long)(int)uVar13;
    lVar5 = -lVar10;
    if (0 < lVar10) {
      lVar5 = lVar10;
    }
    uVar2 = ~(-1 << (sVar3 - (char)uVar2 & 0x1fU)) << ((byte)lVar5 & 0x1f);
    if (-1 < (int)uVar8) {
      lVar5 = (ulong)uVar8 + 1;
      do {
        switch(ctrl & 3) {
        case 0:
          uVar11 = (uint)s->_b_ZMMReg[lVar5 + -1];
          uVar13 = (uint)d->_b_ZMMReg[lVar5 + -1];
          break;
        case 1:
          uVar11 = (uint)*(ushort *)((long)s + lVar5 * 2 + -2);
          uVar13 = (uint)*(ushort *)((long)d + lVar5 * 2 + -2);
          break;
        case 2:
          uVar11 = (uint)(char)s->_b_ZMMReg[lVar5 + -1];
          uVar13 = (uint)(char)d->_b_ZMMReg[lVar5 + -1];
          break;
        case 3:
          uVar11 = (uint)*(short *)((long)s + lVar5 * 2 + -2);
          uVar13 = (uint)*(short *)((long)d + lVar5 * 2 + -2);
        }
        uVar2 = uVar2 * 2 | (uint)(uVar11 == uVar13);
        lVar10 = lVar5 + -1;
        bVar1 = 0 < lVar5;
        lVar5 = lVar10;
      } while (lVar10 != 0 && bVar1);
    }
    goto LAB_0051202a;
  case 3:
    if (validd == 0) {
      uVar2 = (2 << sVar3) - 1;
      goto LAB_0051202a;
    }
    if (-1 < valids - validd) {
      uVar14 = (ulong)(uint)(valids - validd);
      puVar15 = s->_w_ZMMReg + uVar14;
      puVar6 = s->_b_ZMMReg + uVar14;
      uVar2 = 0;
      do {
        uVar11 = 1;
        lVar5 = (ulong)uVar13 + 1;
        if (0 < validd) {
          do {
            switch(ctrl & 3) {
            case 0:
              uVar8 = (uint)puVar6[lVar5 + -1];
              uVar9 = (uint)d->_b_ZMMReg[lVar5 + -1];
              break;
            case 1:
              uVar8 = (uint)puVar15[lVar5 + -1];
              uVar9 = (uint)*(ushort *)((long)d + lVar5 * 2 + -2);
              break;
            case 2:
              uVar8 = (uint)(char)puVar6[lVar5 + -1];
              uVar9 = (uint)(char)d->_b_ZMMReg[lVar5 + -1];
              break;
            case 3:
              uVar8 = (uint)(short)puVar15[lVar5 + -1];
              uVar9 = (uint)*(short *)((long)d + lVar5 * 2 + -2);
            }
            if (uVar8 != uVar9) {
              uVar11 = 0;
            }
            lVar10 = lVar5 + -1;
            bVar1 = 0 < lVar5;
            lVar5 = lVar10;
          } while (lVar10 != 0 && bVar1);
        }
        uVar2 = uVar2 * 2 | uVar11;
        puVar6 = puVar6 + -1;
        puVar15 = puVar15 + -1;
        iVar4 = (int)uVar14;
        uVar14 = uVar14 - 1;
      } while (0 < iVar4);
      goto LAB_0051202a;
    }
  }
  uVar2 = 0;
LAB_0051202a:
  bVar12 = (byte)ctrl >> 4 & 3;
  if (bVar12 == 3) {
    uVar2 = ~(-1 << ((byte)valids & 0x1f) ^ uVar2);
  }
  else if (bVar12 == 1) {
    uVar2 = uVar2 ^ (2 << sVar3) - 1U;
  }
  if ((uVar2 != 0) && (env->cc_src = uVar7 | 1, (uVar2 & 1) != 0)) {
    env->cc_src = uVar7 | 0x801;
  }
  return uVar2;
}

Assistant:

static inline unsigned pcmpxstrx(CPUX86State *env, Reg *d, Reg *s,
                                 int8_t ctrl, int valids, int validd)
{
    unsigned int res = 0;
    int v;
    int j, i;
    int upper = (ctrl & 1) ? 7 : 15;

    valids--;
    validd--;

    CC_SRC = (valids < upper ? CC_Z : 0) | (validd < upper ? CC_S : 0);

    switch ((ctrl >> 2) & 3) {
    case 0:
        for (j = valids; j >= 0; j--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, j);
            for (i = validd; i >= 0; i--) {
                res |= (v == pcmp_val(d, ctrl, i));
            }
        }
        break;
    case 1:
        for (j = valids; j >= 0; j--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, j);
            for (i = ((validd - 1) | 1); i >= 0; i -= 2) {
                res |= (pcmp_val(d, ctrl, i - 0) >= v &&
                        pcmp_val(d, ctrl, i - 1) <= v);
            }
        }
        break;
    case 2:
        res = (1 << (upper - MAX(valids, validd))) - 1;
        res <<= MAX(valids, validd) - MIN(valids, validd);
        for (i = MIN(valids, validd); i >= 0; i--) {
            res <<= 1;
            v = pcmp_val(s, ctrl, i);
            res |= (v == pcmp_val(d, ctrl, i));
        }
        break;
    case 3:
        if (validd == -1) {
            res = (2 << upper) - 1;
            break;
        }
        for (j = valids - validd; j >= 0; j--) {
            res <<= 1;
            v = 1;
            for (i = validd; i >= 0; i--) {
                v &= (pcmp_val(s, ctrl, i + j) == pcmp_val(d, ctrl, i));
            }
            res |= v;
        }
        break;
    }

    switch ((ctrl >> 4) & 3) {
    case 1:
        res ^= (2 << upper) - 1;
        break;
    case 3:
        res ^= (1 << (valids + 1)) - 1;
        break;
    }

    if (res) {
        CC_SRC |= CC_C;
    }
    if (res & 1) {
        CC_SRC |= CC_O;
    }

    return res;
}